

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  uint64_t i;
  ulong uVar2;
  uint64_t n;
  uint64_t t;
  uint64_t local_30;
  ulong local_28;
  
  std::istream::_M_extract<unsigned_long>(&std::cin);
  for (uVar2 = 0; uVar2 < local_28; uVar2 = uVar2 + 1) {
    std::istream::_M_extract<unsigned_long>(&std::cin);
    solve(local_30);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return 0;
}

Assistant:

int main() {
  uint64_t t, n;
  std::cin >> t;
  for (uint64_t i = 0; i < t; ++i) {
    std::cin >> n;
    std::cout << solve(n) << std::endl;
  }
  return 0;
}